

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall rengine::TransformNode::TransformNode(TransformNode *this)

{
  (this->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (this->super_Node).m_parent = (Node *)0x0;
  (this->super_Node).m_child = (Node *)0x0;
  (this->super_Node).m_next = (Node *)0x0;
  (this->super_Node).m_prev = (Node *)0x0;
  *(uint *)&(this->super_Node).field_0x30 =
       (*(uint *)&(this->super_Node).field_0x30 & 0xfffff800) + 1;
  (this->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)&PTR__Node_00116bc0;
  *(undefined8 *)&(this->super_Node).field_0x34 = 0x3f800000;
  *(undefined8 *)&this->field_0x3c = 0;
  *(undefined8 *)&this->field_0x44 = 0x3f80000000000000;
  *(undefined8 *)&this->field_0x4c = 0;
  *(undefined8 *)&this->field_0x54 = 0;
  *(undefined8 *)&this->field_0x5c = 0x3f800000;
  *(undefined8 *)&this->field_0x64 = 0;
  *(undefined8 *)&this->field_0x6c = 0x3f80000000000000;
  *(undefined8 *)&this->field_0x74 = 0;
  return;
}

Assistant:

TransformNode()
        : Node(TransformNodeType)
        , m_projectionDepth(0)
    {
    }